

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O1

vecIdxTy * __thiscall
Apt::ShortestPath(vecIdxTy *__return_storage_ptr__,Apt *this,size_t _startN,size_t _endN,
                 double _maxLen,double _headingAtStart,double _headingAtEnd)

{
  pointer pTVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer puVar4;
  unsigned_long uVar5;
  Apt *pAVar6;
  ulong uVar7;
  size_t sVar8;
  vecIdxTy *pvVar9;
  LTError *this_00;
  size_t *psVar10;
  pointer pTVar11;
  size_t *__dest;
  pointer puVar12;
  int iVar13;
  size_t sVar14;
  bool bVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  size_t updNIdx;
  size_t local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  size_t local_90;
  Apt *local_88;
  double local_80;
  size_t local_78;
  vecIdxTy *local_70;
  double local_68;
  size_t local_60;
  size_t *local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (_startN == _endN) {
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pTVar2 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pTVar1 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (pTVar11 = pTVar1; pTVar11 != pTVar2; pTVar11 = pTVar11 + 1) {
      pTVar11->pathLen = INFINITY;
      pTVar11->prevIdx = 0xffffffffffffffff;
      pTVar11->bVisited = false;
    }
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (size_t *)0x0;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (size_t *)0x0;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar7 = (long)pTVar2 - (long)pTVar1 >> 6;
    local_90 = _endN;
    local_68 = _headingAtEnd;
    local_60 = _startN;
    local_50 = _headingAtStart;
    local_48 = _maxLen;
    if (uVar7 <= _startN) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",_startN
                 ,uVar7);
    }
    if (uVar7 <= _endN) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",_endN,
                 uVar7);
    }
    pTVar1[_startN].pathLen = 0.0;
    pTVar1[_startN].prevIdx = 0xfffffffffffffffe;
    local_70 = __return_storage_ptr__;
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a8,(iterator)0x0,
               &local_60);
    bVar15 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start !=
             local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar16 = pTVar1[local_90].prevIdx == 0xffffffffffffffff;
    local_88 = this;
    if (bVar15 && bVar16) {
      local_58 = &pTVar1[local_90].prevIdx;
      do {
        pAVar6 = local_88;
        pTVar1 = (local_88->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar12 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start;
        dVar18 = pTVar1[*local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start].pathLen;
        psVar10 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start;
        while (local_40 = dVar18, __dest = puVar12, psVar10 = psVar10 + 1,
              psVar10 !=
              local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
          puVar12 = psVar10;
          dVar18 = pTVar1[*psVar10].pathLen;
          if (local_40 <= pTVar1[*psVar10].pathLen) {
            puVar12 = __dest;
            dVar18 = local_40;
          }
        }
        sVar14 = *__dest;
        sVar8 = 0xffffffffffffffff;
        local_78 = sVar14;
        if (pTVar1[sVar14].prevIdx < 0xfffffffffffffffe) {
          sVar8 = GetEdgeBetweenNodes(local_88,pTVar1[sVar14].prevIdx,sVar14);
        }
        local_80 = local_50;
        if (sVar8 != 0xffffffffffffffff) {
          pTVar3 = (pAVar6->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_80 = pTVar3[sVar8].angle;
          if (pTVar3[sVar8].a != pTVar1[sVar14].prevIdx) {
            local_80 = local_80 + 180.0;
          }
        }
        pTVar1[sVar14].bVisited = true;
        psVar10 = __dest + 1;
        if (psVar10 !=
            local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memmove(__dest,psVar10,
                  (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)psVar10);
        }
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        puVar4 = *(pointer *)
                  ((long)&pTVar1[sVar14].vecEdges.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  + 8);
        for (puVar12 = pTVar1[sVar14].vecEdges.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar12 != puVar4; puVar12 = puVar12 + 1) {
          uVar5 = *puVar12;
          pTVar3 = (local_88->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          iVar13 = 10;
          if (pTVar3[uVar5].type - RUN_WAY < 2) {
            sVar14 = pTVar3[uVar5].a;
            if (sVar14 == local_78) {
              sVar14 = pTVar3[uVar5].b;
            }
            pTVar1 = (local_88->vecTaxiNodes).
                     super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_b0 = sVar14;
            if (pTVar1[sVar14].bVisited == false) {
              dVar18 = pTVar3[uVar5].angle;
              if (pTVar3[uVar5].a != local_78) {
                dVar18 = pTVar3[uVar5].angle + 180.0;
              }
              if (((((NAN(local_80)) ||
                    (local_38 = dVar18, dVar17 = HeadingDiff(local_80,dVar18), dVar18 = local_38,
                    ABS(dVar17) <= 100.0)) &&
                   ((NAN(local_68) ||
                    ((local_b0 != local_90 ||
                     (dVar18 = HeadingDiff(local_68,dVar18), ABS(dVar18) <= 100.0)))))) &&
                  (dVar18 = pTVar3[uVar5].dist_m + local_40, dVar18 <= local_48)) &&
                 (dVar18 < pTVar1[sVar14].pathLen)) {
                pTVar1[sVar14].pathLen = dVar18;
                pTVar1[sVar14].prevIdx = local_78;
                iVar13 = 9;
                if (local_b0 != local_90) {
                  iVar13 = 0;
                  push_back_unique<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                            (&local_a8,&local_b0);
                }
              }
            }
          }
          if ((iVar13 != 10) && (iVar13 != 0)) break;
        }
        bVar16 = *local_58 == 0xffffffffffffffff;
        bVar15 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start !=
                 local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      } while ((bVar15) && (*local_58 == 0xffffffffffffffff));
    }
    pvVar9 = local_70;
    if (!bVar16) {
      if (bVar15) {
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      local_b0 = local_90;
      if (local_90 < 0xfffffffffffffffe) {
        do {
          if ((ulong)((long)(local_88->vecTaxiNodes).
                            super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(local_88->vecTaxiNodes).
                            super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
                            super__Vector_impl_data._M_start >> 6) <= local_b0) {
            this_00 = (LTError *)__cxa_allocate_exception(0x18);
            LTError::LTError(this_00,
                             "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
                             ,0x49e,"ShortestPath",logFATAL,"ASSERT FAILED: %s",
                             "nIdx < vecTaxiNodes.size()");
            __cxa_throw(this_00,&LTError::typeinfo,std::logic_error::~logic_error);
          }
          if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a8,
                       (iterator)
                       local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_b0);
          }
          else {
            *local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_b0;
            local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_b0 = (local_88->vecTaxiNodes).
                     super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
                     super__Vector_impl_data._M_start[local_b0].prevIdx;
        } while (local_b0 < 0xfffffffffffffffe);
      }
      (local_70->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start =
           local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      (local_70->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (local_70->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      pvVar9 = &local_a8;
    }
    __return_storage_ptr__ = local_70;
    (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (size_t *)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vecIdxTy ShortestPath (size_t _startN, size_t _endN, double _maxLen,
                           double _headingAtStart,
                           double _headingAtEnd)
    {
        // Sanity check: _start and _end should differ
        if (_startN == _endN)
            return vecIdxTy();


        // Initialize the Dijkstra values in the nodes array
        for (TaxiNode& n: vecTaxiNodes)
            n.InitDijkstraAttr();

        // This array stores nodes we need to visit
        // (have an initial distance, but aren't fully visited yet)
        vecIdxTy vecVisit;

        // The start place is the given taxiway node
        TaxiNode& startN = vecTaxiNodes.at(_startN);
        const TaxiNode& endN   = vecTaxiNodes.at(_endN);
        startN.pathLen = 0.0;
        startN.prevIdx = ULONG_MAX-1;   // we use "ULONG_MAX-1" for saying "is a start node"
        vecVisit.push_back(_startN);

        // General heading between start and end (reversed)
        // defines first heading (how we leave _startN) and
        // how far the plane is allowed to turn
        
        // outer loop controls currently visited node and checks if end already found
        while (!vecVisit.empty() && endN.prevIdx == ULONG_MAX)
        {
            // fetch node with shortest yet known distance
            // (this isn't awfully efficient, but keeping a separate map or prio-queue
            //  sorted while updating nodes in the next loop
            //  is not simple either. I expect vecVisit to stay short
            //  due to cut-off at _maxLen, so I've decided this way:)
            vecIdxTy::iterator shortestIter = vecVisit.begin();
            double shortestDist = vecTaxiNodes[*shortestIter].pathLen;
            for (vecIdxTy::iterator i = std::next(shortestIter);
                 i != vecVisit.end(); ++i)
            {
                if (vecTaxiNodes[*i].pathLen < shortestDist) {
                    shortestIter = i;
                    shortestDist = vecTaxiNodes[*i].pathLen;
                }
            }
            const size_t shortestNIdx  = *shortestIter;
            TaxiNode& shortestN = vecTaxiNodes[shortestNIdx];
            
            // To avoid too sharp corners we need to know the angle by which we reach this shortest node
            const size_t idxEdgeToShortestN =
            shortestN.prevIdx >= ULONG_MAX-1 ? EDGE_UNKNOWN :
            GetEdgeBetweenNodes(shortestN.prevIdx, shortestNIdx);
            // start heading for when leaving first node, otherwise heading between previous and current node
            const double angleToShortestN =
            idxEdgeToShortestN == EDGE_UNKNOWN ? _headingAtStart :
            vecTaxiEdges[idxEdgeToShortestN].GetAngleFrom(shortestN.prevIdx);
            
            // This one is now already counted as "visited" so no more updates to its pathLen!
            shortestN.bVisited = true;
            vecVisit.erase(shortestIter);

            // Update all connected nodes with best possible distance
            for (size_t eIdx: shortestN.vecEdges)
            {
                const TaxiEdge& e = vecTaxiEdges[eIdx];
                if (!e.isValid()) continue;
                
                size_t updNIdx    = e.otherNode(shortestNIdx);
                TaxiNode& updN    = vecTaxiNodes[updNIdx];
                
                // if aleady visited then no need to re-assess
                if (updN.bVisited)
                    continue;
                
                // Don't allow turns of more than 100°,
                // ie. edge not valid if it would turn more than that
                const double eAngle = e.GetAngleFrom(shortestNIdx);
                if (!std::isnan(angleToShortestN) &&
                    std::abs(HeadingDiff(angleToShortestN,
                                         eAngle)) > APT_MAX_PATH_TURN)
                    continue;
                
                // If the node being analyzed is the end node, then we also
                // need to verify if the heading from end node to actual a/c position
                // would not again cause too sharp a turn:
                if (updNIdx == _endN && !std::isnan(_headingAtEnd) &&
                    std::abs(HeadingDiff(_headingAtEnd, eAngle)) > APT_MAX_PATH_TURN)
                    continue;
                
                // Calculate the yet known best distance to this node
                const double lenToUpd = shortestDist + e.dist_m;
                if (lenToUpd > _maxLen ||               // too far out?
                    updN.pathLen <= lenToUpd)           // node has a faster path already
                    continue;

                // Update this node with new best values
                updN.pathLen = lenToUpd;        // best new known distance
                updN.prevIdx = shortestNIdx;     // predecessor to achieve that distance
                
                // Have we reached the wanted end node?
                if (updNIdx == _endN)
                    break;
                
                // this node is now ready to be visited
                push_back_unique(vecVisit, updNIdx);
            }
        }
        
        // Found nothing? -> return empty list
        if (endN.prevIdx == ULONG_MAX)
            return vecIdxTy();
        
        // put together the nodes from _start through _end in the right order
        vecVisit.clear();
        for (size_t nIdx = _endN;
             nIdx < ULONG_MAX-1;                    // until nIdx becomes invalid
             nIdx = vecTaxiNodes[nIdx].prevIdx)     // move on to _previous_ node on shortest path
        {
            LOG_ASSERT(nIdx < vecTaxiNodes.size());
            vecVisit.push_back(nIdx);
        }
        return vecVisit;
    }